

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcIfif.c
# Opt level: O0

float Abc_ObjDelayDegree(Abc_IffMan_t *p,Abc_Obj_t *pObj,int d)

{
  int iVar1;
  float fVar2;
  float fVar3;
  Abc_Obj_t *local_58;
  Abc_Obj_t *ppNodes [6];
  float DelayNew;
  float Delay0;
  int i;
  int d_local;
  Abc_Obj_t *pObj_local;
  Abc_IffMan_t *p_local;
  
  ppNodes[5]._4_4_ = 0.0;
  if ((-1 < d) && (d <= p->pPars->nDegree)) {
    Abc_ObjSortByDelay(p,pObj,p->pPars->nDegree,&local_58);
    DelayNew = 0.0;
    while( true ) {
      iVar1 = Abc_ObjFaninNum(pObj);
      if (iVar1 <= (int)DelayNew) break;
      fVar2 = Abc_IffDelay(p,ppNodes[(long)(int)DelayNew + -1],p->pPars->nDegree);
      fVar2 = fVar2 + p->pPars->pLutDelays[(int)DelayNew];
      ppNodes[5]._0_4_ = fVar2;
      if ((DelayNew == 0.0) && (0 < d)) {
        fVar3 = Abc_IffDelay(p,local_58,d + -1);
        ppNodes[5]._0_4_ =
             Abc_MinFloat(fVar2,(fVar3 + p->pPars->pLutDelays[0]) - p->pPars->DelayWire);
      }
      ppNodes[5]._4_4_ = Abc_MaxFloat(ppNodes[5]._4_4_,ppNodes[5]._0_4_);
      DelayNew = (float)((int)DelayNew + 1);
    }
    return ppNodes[5]._4_4_;
  }
  __assert_fail("d >= 0 && d <= p->pPars->nDegree",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcIfif.c"
                ,0xe8,"float Abc_ObjDelayDegree(Abc_IffMan_t *, Abc_Obj_t *, int)");
}

Assistant:

float Abc_ObjDelayDegree( Abc_IffMan_t * p, Abc_Obj_t * pObj, int d )
{
    int i;
    float Delay0 = 0, DelayNew;
    Abc_Obj_t * ppNodes[6];
    assert( d >= 0 && d <= p->pPars->nDegree );
    Abc_ObjSortByDelay( p, pObj, p->pPars->nDegree, ppNodes );
    for ( i = 0; i < Abc_ObjFaninNum(pObj); i++ )
    {
        DelayNew = Abc_IffDelay(p, ppNodes[i], p->pPars->nDegree) + p->pPars->pLutDelays[i];
        if ( i == 0 && d > 0 )
            DelayNew = Abc_MinFloat(DelayNew, Abc_IffDelay(p, ppNodes[i], d-1) + p->pPars->pLutDelays[i] - p->pPars->DelayWire );
        Delay0 = Abc_MaxFloat( Delay0, DelayNew );
    }
    return Delay0;
}